

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O3

target_ulong helper_lar_x86_64(CPUX86State *env,target_ulong selector1)

{
  uint32_t uVar1;
  uint32_t uVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  abi_ptr addr;
  uint uVar7;
  uintptr_t unaff_retaddr;
  
  uVar1 = cpu_cc_compute_all_x86_64(env,env->cc_op);
  uVar7 = (uint)selector1;
  if ((selector1 & 0xfffc) != 0) {
    lVar3 = 0x148;
    if ((selector1 & 4) == 0) {
      lVar3 = 0x178;
    }
    if ((uVar7 & 0xffff | 7) <= *(uint *)((long)env->regs + lVar3 + 0x10)) {
      uVar5 = 2;
      uVar4 = 2;
      addr = (ulong)(uVar7 & 0xfff8) + *(long *)((long)env->regs + lVar3 + 8);
      if (((env->hflags >> 0x17 & 1) != 0) && (uVar4 = 0, (~env->hflags & 3) != 0)) {
        uVar4 = (uint)env->eflags >> 0x11 & 2;
      }
      cpu_ldl_mmuidx_ra_x86_64(env,addr,uVar4,unaff_retaddr);
      if (((env->hflags >> 0x17 & 1) != 0) && (uVar5 = 0, (~env->hflags & 3) != 0)) {
        uVar5 = (uint)env->eflags >> 0x11 & 2;
      }
      uVar2 = cpu_ldl_mmuidx_ra_x86_64(env,addr + 4,uVar5,unaff_retaddr);
      uVar4 = uVar2 >> 0xd & 3;
      uVar5 = env->hflags & 3;
      if ((uVar2 >> 0xc & 1) == 0) {
        uVar6 = uVar2 >> 8 & 0xf;
        if ((uVar6 < 0xd) &&
           (((0x1a3eU >> uVar6 & 1) != 0 && (uVar5 <= uVar4 && (uVar7 & 3) <= uVar4)))) {
LAB_0051c172:
          env->cc_src = (ulong)(uVar1 | 0x40);
          return (ulong)(uVar2 & 0xf0ff00);
        }
      }
      else if (((~uVar2 & 0xc00) == 0) || ((uVar7 & 3) <= uVar4 && uVar5 <= uVar4))
      goto LAB_0051c172;
    }
  }
  env->cc_src = (ulong)(uVar1 & 0xffffffbf);
  return 0;
}

Assistant:

target_ulong helper_lar(CPUX86State *env, target_ulong selector1)
{
    uint32_t e1, e2, eflags, selector;
    int rpl, dpl, cpl, type;

    selector = selector1 & 0xffff;
    eflags = cpu_cc_compute_all(env, CC_OP);
    if ((selector & 0xfffc) == 0) {
        goto fail;
    }
    if (load_segment_ra(env, &e1, &e2, selector, GETPC()) != 0) {
        goto fail;
    }
    rpl = selector & 3;
    dpl = (e2 >> DESC_DPL_SHIFT) & 3;
    cpl = env->hflags & HF_CPL_MASK;
    if (e2 & DESC_S_MASK) {
        if ((e2 & DESC_CS_MASK) && (e2 & DESC_C_MASK)) {
            /* conforming */
        } else {
            if (dpl < cpl || dpl < rpl) {
                goto fail;
            }
        }
    } else {
        type = (e2 >> DESC_TYPE_SHIFT) & 0xf;
        switch (type) {
        case 1:
        case 2:
        case 3:
        case 4:
        case 5:
        case 9:
        case 11:
        case 12:
            break;
        default:
            goto fail;
        }
        if (dpl < cpl || dpl < rpl) {
        fail:
            CC_SRC = eflags & ~CC_Z;
            return 0;
        }
    }
    CC_SRC = eflags | CC_Z;
    return e2 & 0x00f0ff00;
}